

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void fprint_vector_stats(FILE *file,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,
                        char *hdr,bool do_json)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  char *__format;
  unsigned_long uVar4;
  long lVar5;
  unsigned_long uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  puVar1 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar2 - (long)puVar1 >> 3;
  if (puVar2 == puVar1) {
    uVar9 = 0;
    dVar16 = 0.0;
    dVar19 = 0.0;
  }
  else {
    uVar9 = lVar5 + (ulong)(lVar5 == 0);
    dVar16 = 0.0;
    dVar19 = 0.0;
    uVar7 = 0;
    do {
      uVar3 = puVar1[uVar7];
      dVar16 = dVar16 + ((double)(uVar3 * uVar3 >> 0x20 | 0x4530000000000000) -
                        1.9342813118337666e+25) +
                        (double)(uVar3 * uVar3 & 0xffffffff | 0x4330000000000000);
      dVar19 = dVar19 + ((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                        (double)(uVar3 & 0xffffffff | 0x4330000000000000);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  if (puVar2 == puVar1) {
    uVar10 = 0;
    dVar19 = 0.0;
    uVar4 = 0;
    uVar6 = 0;
    uVar8 = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16;
    auVar18 = auVar18 << 0x40;
  }
  else {
    auVar11._8_4_ = (int)((long)puVar2 - (long)puVar1 >> 0x23);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    auVar15._0_8_ =
         ((double)(uVar9 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(uVar9 & 0xffffffff | 0x4330000000000000);
    auVar15._8_8_ =
         ((double)(lVar5 - 1U >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(lVar5 - 1U & 0xffffffff | 0x4330000000000000);
    auVar17._8_8_ =
         dVar16 - (dVar19 * dVar19) /
                  ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    auVar17._0_8_ = dVar19;
    uVar10 = puVar1[uVar9 >> 1];
    if ((uVar9 & 1) == 0) {
      lVar5 = uVar10 + puVar1[(uVar9 >> 1) - 1];
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = 0x45300000;
      dVar19 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.5;
    }
    else {
      auVar13._8_4_ = (int)(uVar10 >> 0x20);
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = 0x45300000;
      dVar19 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    }
    auVar18 = divpd(auVar17,auVar15);
    uVar10 = *puVar1;
    uVar4 = puVar1[(long)(auVar15._0_8_ * 0.025)];
    uVar6 = puVar1[(long)(auVar15._0_8_ * 0.975)];
    uVar8 = puVar1[uVar9 - 1];
  }
  dVar16 = auVar18._8_8_;
  if (dVar16 < 0.0) {
    dVar14 = sqrt(dVar16);
  }
  else {
    dVar14 = SQRT(dVar16);
  }
  __format = 
  "\n%s\n    mean:                %g\n    median:              %g\n    variance             %g\n    standard deviation:  %g\n    min:                 %ld\n    2.5%%:                %ld\n    97.5%%:               %ld\n    max:                 %ld\n"
  ;
  if (do_json) {
    __format = 
    ",\n\t\"%s\": {\n\t\t\"mean\":                %g,\n\t\t\"median\":              %g,\n\t\t\"variance\":            %g,\n\t\t\"standard deviation\":  %g,\n\t\t\"min\":                 %ld,\n\t\t\"2.5%%\":                %ld,\n\t\t\"97.5%%\":               %ld,\n\t\t\"max\":                 %ld}"
    ;
  }
  fprintf((FILE *)file,__format,auVar18._0_8_,dVar19,dVar16,dVar14,hdr,uVar10,uVar4,uVar6,uVar8);
  return;
}

Assistant:

void fprint_vector_stats( FILE * file, std::vector<size_t> & vec, const char * hdr, bool do_json )
{
    double sum = 0.,
           var = 0.,
           mean = 0.,
           median = 0.;
           
    long min = 0,
         two5 = 0,
         ninetyseven5 = 0,
         max = 0;
         
    size_t i;

    for ( i = 0; i < vec.size(); ++i ) {
        sum += vec[i];
        var += vec[i] * vec[i];
    }

    // remember, i == vec.size()

    if ( vec.size() ) {
        var = ( var - ( sum * sum ) / vec.size() ) / ( vec.size() - 1 );
        mean = sum / i;
        median = ( i % 2 ) ? 1.0 * vec[i / 2] : 0.5 * ( vec[i / 2] + vec[i / 2 - 1] );
        min = vec[0];
        two5 = vec[long( 0.025 * i )];
        ninetyseven5 = vec[long( 0.975 * i )];
        max = vec[i - 1];
    }

    if (do_json) {
        fprintf( file, ",\n\t\"%s\": {"
                 "\n\t\t\"mean\":                %g,"
                 "\n\t\t\"median\":              %g,"
                 "\n\t\t\"variance\":            %g,"
                 "\n\t\t\"standard deviation\":  %g,"
                 "\n\t\t\"min\":                 %ld,"
                 "\n\t\t\"2.5%%\":                %ld,"
                 "\n\t\t\"97.5%%\":               %ld,"
                 "\n\t\t\"max\":                 %ld}",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
                );
   }
    else {
        fprintf( file, "\n%s\n"
                 "    mean:                %g\n"
                 "    median:              %g\n"
                 "    variance             %g\n"
                 "    standard deviation:  %g\n"
                 "    min:                 %ld\n"
                 "    2.5%%:                %ld\n"
                 "    97.5%%:               %ld\n"
                 "    max:                 %ld\n",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
               );
        }
}